

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

ForwardInterfaceClassTypedefDeclarationSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ForwardInterfaceClassTypedefDeclarationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,Token *args_2,Token *args_3,Token *args_4,Token *args_5)

{
  Info *pIVar1;
  Info *pIVar2;
  size_type sVar3;
  pointer ppAVar4;
  Info *pIVar5;
  Info *pIVar6;
  Info *pIVar7;
  SyntaxKind SVar8;
  undefined4 uVar9;
  TokenKind TVar10;
  undefined1 uVar11;
  NumericTokenFlags NVar12;
  uint32_t uVar13;
  TokenKind TVar14;
  undefined1 uVar15;
  NumericTokenFlags NVar16;
  uint32_t uVar17;
  TokenKind TVar18;
  undefined1 uVar19;
  NumericTokenFlags NVar20;
  uint32_t uVar21;
  TokenKind TVar22;
  undefined1 uVar23;
  NumericTokenFlags NVar24;
  uint32_t uVar25;
  TokenKind TVar26;
  undefined1 uVar27;
  NumericTokenFlags NVar28;
  uint32_t uVar29;
  ForwardInterfaceClassTypedefDeclarationSyntax *pFVar30;
  long lVar31;
  
  pFVar30 = (ForwardInterfaceClassTypedefDeclarationSyntax *)
            ((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ForwardInterfaceClassTypedefDeclarationSyntax *)this->endPtr < pFVar30 + 1) {
    pFVar30 = (ForwardInterfaceClassTypedefDeclarationSyntax *)allocateSlow(this,0x90,8);
  }
  else {
    this->head->current = (byte *)(pFVar30 + 1);
  }
  TVar10 = args_1->kind;
  uVar11 = args_1->field_0x2;
  NVar12.raw = (args_1->numFlags).raw;
  uVar13 = args_1->rawLen;
  pIVar1 = args_1->info;
  TVar14 = args_2->kind;
  uVar15 = args_2->field_0x2;
  NVar16.raw = (args_2->numFlags).raw;
  uVar17 = args_2->rawLen;
  pIVar2 = args_2->info;
  TVar18 = args_3->kind;
  uVar19 = args_3->field_0x2;
  NVar20.raw = (args_3->numFlags).raw;
  uVar21 = args_3->rawLen;
  pIVar5 = args_3->info;
  TVar22 = args_4->kind;
  uVar23 = args_4->field_0x2;
  NVar24.raw = (args_4->numFlags).raw;
  uVar25 = args_4->rawLen;
  pIVar6 = args_4->info;
  TVar26 = args_5->kind;
  uVar27 = args_5->field_0x2;
  NVar28.raw = (args_5->numFlags).raw;
  uVar29 = args_5->rawLen;
  pIVar7 = args_5->info;
  (pFVar30->super_MemberSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pFVar30->super_MemberSyntax).super_SyntaxNode.kind = ForwardInterfaceClassTypedefDeclaration;
  SVar8 = (args->super_SyntaxListBase).super_SyntaxNode.kind;
  uVar9 = *(undefined4 *)&(args->super_SyntaxListBase).super_SyntaxNode.field_0xc;
  (pFVar30->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
       (args->super_SyntaxListBase).super_SyntaxNode.parent;
  (pFVar30->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind = SVar8;
  *(undefined4 *)
   &(pFVar30->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0xc = uVar9
  ;
  (pFVar30->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_004e9f08;
  (pFVar30->super_MemberSyntax).attributes.super_SyntaxListBase.childCount =
       (args->super_SyntaxListBase).childCount;
  sVar3 = (args->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).size_
  ;
  (pFVar30->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.data_ =
       (args->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).data_;
  (pFVar30->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_ = sVar3;
  (pFVar30->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_004ea348;
  (pFVar30->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
       (SyntaxNode *)pFVar30;
  sVar3 = (pFVar30->super_MemberSyntax).attributes.
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_;
  if (sVar3 != 0) {
    ppAVar4 = (pFVar30->super_MemberSyntax).attributes.
              super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.data_;
    lVar31 = 0;
    do {
      **(undefined8 **)((long)ppAVar4 + lVar31) = pFVar30;
      lVar31 = lVar31 + 8;
    } while (sVar3 << 3 != lVar31);
  }
  (pFVar30->typedefKeyword).kind = TVar10;
  (pFVar30->typedefKeyword).field_0x2 = uVar11;
  (pFVar30->typedefKeyword).numFlags = (NumericTokenFlags)NVar12.raw;
  (pFVar30->typedefKeyword).rawLen = uVar13;
  (pFVar30->typedefKeyword).info = pIVar1;
  (pFVar30->interfaceKeyword).kind = TVar14;
  (pFVar30->interfaceKeyword).field_0x2 = uVar15;
  (pFVar30->interfaceKeyword).numFlags = (NumericTokenFlags)NVar16.raw;
  (pFVar30->interfaceKeyword).rawLen = uVar17;
  (pFVar30->interfaceKeyword).info = pIVar2;
  (pFVar30->classKeyword).kind = TVar18;
  (pFVar30->classKeyword).field_0x2 = uVar19;
  (pFVar30->classKeyword).numFlags = (NumericTokenFlags)NVar20.raw;
  (pFVar30->classKeyword).rawLen = uVar21;
  (pFVar30->classKeyword).info = pIVar5;
  (pFVar30->name).kind = TVar22;
  (pFVar30->name).field_0x2 = uVar23;
  (pFVar30->name).numFlags = (NumericTokenFlags)NVar24.raw;
  (pFVar30->name).rawLen = uVar25;
  (pFVar30->name).info = pIVar6;
  (pFVar30->semi).kind = TVar26;
  (pFVar30->semi).field_0x2 = uVar27;
  (pFVar30->semi).numFlags = (NumericTokenFlags)NVar28.raw;
  (pFVar30->semi).rawLen = uVar29;
  (pFVar30->semi).info = pIVar7;
  return pFVar30;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }